

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::GetTransitionType
          (TimeZoneInfo *this,int_fast32_t utc_offset,bool is_dst,string *abbr,uint_least8_t *index)

{
  const_iterator __position;
  int iVar1;
  iterator iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pTVar7;
  long lVar8;
  
  uVar6 = (this->abbreviations_)._M_string_length;
  pTVar7 = (this->transition_types_).
           super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->transition_types_).
      super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
      ._M_impl.super__Vector_impl_data._M_finish == pTVar7) {
    uVar5 = 0;
  }
  else {
    lVar8 = 0x29;
    uVar5 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)abbr);
      uVar3 = (ulong)*(byte *)((long)&pTVar7->utc_offset + lVar8);
      uVar4 = uVar3;
      if (iVar1 != 0) {
        uVar4 = uVar6;
      }
      if (((*(int *)((long)pTVar7 + lVar8 + -0x29) == utc_offset) &&
          ((bool)*(char *)((long)pTVar7 + lVar8 + -1) == is_dst)) && (uVar6 = uVar3, uVar4 == uVar3)
         ) break;
      uVar5 = uVar5 + 1;
      pTVar7 = (this->transition_types_).
               super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x30;
      uVar6 = uVar4;
    } while (uVar5 != ((long)(this->transition_types_).
                             super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 4) *
                      -0x5555555555555555);
  }
  if (uVar6 < 0x100 && uVar5 < 0x100) {
    __position._M_current =
         (this->transition_types_).
         super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar5 == ((long)__position._M_current -
                  (long)(this->transition_types_).
                        super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) {
      iVar2 = std::
              vector<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
              ::_M_emplace_aux<>(&this->transition_types_,__position);
      (iVar2._M_current)->utc_offset = (int_least32_t)utc_offset;
      (iVar2._M_current)->is_dst = is_dst;
      if (uVar6 == (this->abbreviations_)._M_string_length) {
        std::__cxx11::string::_M_append
                  ((char *)&this->abbreviations_,(ulong)(abbr->_M_dataplus)._M_p);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&this->abbreviations_,(this->abbreviations_)._M_string_length,0,'\x01');
      }
      (iVar2._M_current)->abbr_index = (uint_least8_t)uVar6;
    }
    *index = (uint_least8_t)uVar5;
  }
  return uVar6 < 0x100 && uVar5 < 0x100;
}

Assistant:

bool TimeZoneInfo::GetTransitionType(std::int_fast32_t utc_offset, bool is_dst,
                                     const std::string& abbr,
                                     std::uint_least8_t* index) {
  std::size_t type_index = 0;
  std::size_t abbr_index = abbreviations_.size();
  for (; type_index != transition_types_.size(); ++type_index) {
    const TransitionType& tt(transition_types_[type_index]);
    const char* tt_abbr = &abbreviations_[tt.abbr_index];
    if (tt_abbr == abbr) abbr_index = tt.abbr_index;
    if (tt.utc_offset == utc_offset && tt.is_dst == is_dst) {
      if (abbr_index == tt.abbr_index) break;  // reuse
    }
  }
  if (type_index > 255 || abbr_index > 255) {
    // No index space (8 bits) available for a new type or abbreviation.
    return false;
  }
  if (type_index == transition_types_.size()) {
    TransitionType& tt(*transition_types_.emplace(transition_types_.end()));
    tt.utc_offset = static_cast<std::int_least32_t>(utc_offset);
    tt.is_dst = is_dst;
    if (abbr_index == abbreviations_.size()) {
      abbreviations_.append(abbr);
      abbreviations_.append(1, '\0');
    }
    tt.abbr_index = static_cast<std::uint_least8_t>(abbr_index);
  }
  *index = static_cast<std::uint_least8_t>(type_index);
  return true;
}